

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createUnaryOp(Builder *this,Op opCode,Id typeId,Id operand)

{
  Id resultId;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_70;
  pointer local_68;
  Instruction *op;
  allocator<unsigned_int> local_41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  Id local_24;
  Id local_20;
  Id operand_local;
  Id typeId_local;
  Op opCode_local;
  Builder *this_local;
  
  local_24 = operand;
  local_20 = typeId;
  operand_local = opCode;
  _typeId_local = this;
  if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
    this_00 = (Instruction *)::operator_new(0x60);
    resultId = getUniqueId(this);
    spv::Instruction::Instruction(this_00,resultId,local_20,operand_local);
    local_68 = this_00;
    spv::Instruction::addIdOperand(this_00,local_24);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_70,
               local_68);
    addInstruction(this,&local_70);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_70);
    this_local._4_4_ = spv::Instruction::getResultId(local_68);
  }
  else {
    std::allocator<unsigned_int>::allocator(&local_41);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_40,1,&local_24,&local_41);
    memset(&op,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&op);
    this_local._4_4_ =
         createSpecConstantOp
                   (this,opCode,typeId,&local_40,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&op);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&op);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
    std::allocator<unsigned_int>::~allocator(&local_41);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createUnaryOp(Op opCode, Id typeId, Id operand)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        return createSpecConstantOp(opCode, typeId, std::vector<Id>(1, operand), std::vector<Id>());
    }
    Instruction* op = new Instruction(getUniqueId(), typeId, opCode);
    op->addIdOperand(operand);
    addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}